

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitGlobalGet(BinaryInstWriter *this,GlobalGet *curr)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  iterator iVar4;
  size_t sVar5;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  ulong uVar6;
  GlobalGet *local_38;
  
  uVar3 = WasmBinaryWriter::getGlobalIndex(this->parent,(Name)(curr->name).super_IString.str);
  local_38 = curr;
  iVar4 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->extractedGets)._M_h,(key_type *)&local_38);
  if (iVar4.super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false>.
      _M_cur == (__node_type *)0x0) {
    sVar5 = wasm::Type::size(&(curr->super_SpecificExpression<(wasm::Expression::Id)10>).
                              super_Expression.type);
    if (sVar5 != 0) {
      uVar6 = 1;
      do {
        pvVar1 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_38 = (GlobalGet *)CONCAT71(local_38._1_7_,0x23);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (pvVar1,(uchar *)&local_38);
        local_38 = (GlobalGet *)CONCAT44(local_38._4_4_,uVar3);
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)&local_38,(int)pvVar1,__buf_00,in_RCX);
        uVar3 = uVar3 + 1;
        bVar2 = uVar6 < sVar5;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar2);
    }
  }
  else {
    pvVar1 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    local_38 = (GlobalGet *)CONCAT71(local_38._1_7_,0x23);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (pvVar1,(uchar *)&local_38);
    local_38 = (GlobalGet *)
               CONCAT44(local_38._4_4_,
                        uVar3 + *(int *)((long)iVar4.
                                               super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false>
                                               ._M_cur + 0x10));
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)&local_38,(int)pvVar1,__buf,in_RCX);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitGlobalGet(GlobalGet* curr) {
  Index index = parent.getGlobalIndex(curr->name);
  if (auto it = extractedGets.find(curr); it != extractedGets.end()) {
    // We have a tuple of globals to get, but we will only end up using one of
    // them, so we can just emit that one.
    o << int8_t(BinaryConsts::GlobalGet) << U32LEB(index + it->second);
    return;
  }
  // Emit a global.get for each element if this is a tuple global
  size_t numValues = curr->type.size();
  for (Index i = 0; i < numValues; ++i) {
    o << int8_t(BinaryConsts::GlobalGet) << U32LEB(index + i);
  }
}